

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

string * __thiscall
wabt::(anonymous_namespace)::TypesToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TypeVector *types,char *prefix
          )

{
  size_type sVar1;
  const_reference pvVar2;
  char *pcVar3;
  ulong local_40;
  size_t i;
  allocator local_22;
  undefined1 local_21;
  TypeVector *local_20;
  char *prefix_local;
  TypeVector *types_local;
  string *result;
  
  local_21 = 0;
  local_20 = types;
  prefix_local = (char *)this;
  types_local = (TypeVector *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"[",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  if (local_20 != (TypeVector *)0x0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char *)local_20);
  }
  for (local_40 = 0;
      sVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                        ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)prefix_local),
      local_40 < sVar1; local_40 = local_40 + 1) {
    pvVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                       ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)prefix_local,local_40);
    pcVar3 = GetTypeName(*pvVar2);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar3);
    sVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)prefix_local);
    if (local_40 < sVar1 - 1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"]");
  return __return_storage_ptr__;
}

Assistant:

std::string TypesToString(const TypeVector& types,
                          const char* prefix = nullptr) {
  std::string result = "[";
  if (prefix) {
    result += prefix;
  }

  for (size_t i = 0; i < types.size(); ++i) {
    result += GetTypeName(types[i]);
    if (i < types.size() - 1) {
      result += ", ";
    }
  }
  result += "]";
  return result;
}